

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa-verify.c
# Opt level: O1

int dsa_verify_hash_der(uint8_t *sha1,uchar *pubkey,size_t pubkey_len,uchar *sig,size_t sig_len)

{
  int iVar1;
  uint uVar2;
  mp_int keyQ;
  mp_int r;
  mp_int s;
  mp_int keyP;
  mp_int local_d8;
  mp_int u1;
  mp_int v;
  mp_int w;
  mp_int hash;
  mp_int keyY;
  mp_int keyG;
  
  mp_init_multi(&keyP,&keyQ,&keyG,&keyY,&r,&s,&hash,0);
  iVar1 = parse_der_pubkey(pubkey,pubkey_len,&keyP,&keyQ,&keyG,&keyY);
  if (iVar1 == 0) {
    uVar2 = 0xfffffffd;
    goto LAB_001038a9;
  }
  iVar1 = parse_der_signature(sig,sig_len,&r,&s);
  if (iVar1 == 0) {
    uVar2 = 0xfffffffb;
    goto LAB_001038a9;
  }
  mp_read_unsigned_bin(&hash,sha1,0x14);
  iVar1 = mp_init_multi(&w,&v,&u1,&local_d8,0);
  if (iVar1 == 0) {
    uVar2 = 0xfffffffb;
    if ((r.used != 0) && (s.used != 0)) {
      iVar1 = mp_cmp(&r,&keyQ);
      if (iVar1 == -1) {
        iVar1 = mp_cmp(&s,&keyQ);
        if (iVar1 == -1) {
          iVar1 = mp_invmod(&s,&keyQ,&w);
          if (iVar1 == 0) {
            iVar1 = mp_mulmod(&hash,&w,&keyQ,&u1);
            if (iVar1 == 0) {
              iVar1 = mp_mulmod(&r,&w,&keyQ,&local_d8);
              if (iVar1 == 0) {
                iVar1 = mp_exptmod(&keyG,&u1,&keyP,&u1);
                if (iVar1 == 0) {
                  iVar1 = mp_exptmod(&keyY,&local_d8,&keyP,&local_d8);
                  if (iVar1 == 0) {
                    iVar1 = mp_mulmod(&u1,&local_d8,&keyP,&v);
                    if (iVar1 == 0) {
                      iVar1 = mp_mod(&v,&keyQ,&v);
                      uVar2 = 0xffffffff;
                      if (iVar1 == 0) {
                        iVar1 = mp_cmp(&r,&v);
                        uVar2 = (uint)(iVar1 == 0);
                      }
                      goto LAB_00103871;
                    }
                  }
                }
              }
            }
          }
          goto LAB_0010386c;
        }
      }
    }
  }
  else {
LAB_0010386c:
    uVar2 = 0xffffffff;
  }
LAB_00103871:
  mp_clear_multi(&w,&v,&u1,&local_d8,0);
LAB_001038a9:
  mp_clear_multi(&keyP,&keyQ,&keyG,&keyY,&r,&s,&hash,0);
  return uVar2;
}

Assistant:

int dsa_verify_hash_der(const SHA1_t sha1, const unsigned char* pubkey, size_t pubkey_len, const unsigned char* sig, size_t sig_len)
{
	// Parse public key
	mp_int keyP, keyQ, keyG, keyY, r, s, hash;
	mp_init_multi(&keyP, &keyQ, &keyG, &keyY, &r, &s, &hash, NULL);

	int ret;

	if (parse_der_pubkey(pubkey, pubkey_len, &keyP, &keyQ, &keyG, &keyY) == 0)
	{
		ret = DSA_KEY_PARAM_ERROR;
		goto error;
	}

	// Parse signature
	if (parse_der_signature(sig, sig_len, &r, &s) == 0)
	{
		ret = DSA_SIGNATURE_PARAM_ERROR;
		goto error;
	}

	// Read hash, verify data
	mp_read_unsigned_bin(&hash, sha1, sizeof(SHA1_t));

	ret = _dsa_verify_hash(&hash, &keyP, &keyQ, &keyG, &keyY, &r, &s);

error:
	mp_clear_multi(&keyP, &keyQ, &keyG, &keyY, &r, &s, &hash, NULL);

	return ret;
}